

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

Var Js::BoundFunction::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  uint32 lhs;
  RecyclableObject *obj;
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  uint uVar4;
  uint uVar5;
  CallFlags CVar6;
  BOOL BVar7;
  Var *values;
  undefined4 *puVar8;
  ScriptContext *scriptContext_00;
  RecyclableObject **ppRVar9;
  ThreadContext *pTVar10;
  Recycler *pRVar11;
  Var pvVar12;
  ulong uVar13;
  WriteBarrierPtr<void> **ppWVar14;
  void **ppvVar15;
  JavascriptMethod entryPoint;
  Arguments local_158;
  undefined1 local_148 [8];
  AutoReentrancyHandler autoReentrancyHandler_2;
  Var aReturnValue;
  Arguments local_128;
  uint local_114;
  uint local_110;
  uint i_1;
  uint i;
  uint index;
  undefined8 local_100;
  TrackAllocData local_f8;
  WriteBarrierPtr<void> *local_d0;
  Type *newValues;
  uint32 newArgCount;
  uint argCount;
  Arguments actualArgs;
  AutoReentrancyHandler autoReentrancyHandler_1;
  undefined1 local_90 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  FunctionInfo *functionInfo;
  RecyclableObject *newTarget;
  Var newTargetVar;
  Var newVarInstance;
  RecyclableObject *targetFunction;
  BoundFunction *boundFunction;
  ScriptContext *scriptContext;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x67,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  scriptContext_00 = RecyclableObject::GetScriptContext(function);
  if (((ulong)local_40 & 0xffffff) != 0) {
    ppRVar9 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)(function + 3));
    obj = *ppRVar9;
    newTargetVar = (Var)0x0;
    CVar6 = callInfo._3_4_;
    CVar3 = Js::operator&(CVar6 & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                   CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|
                                   CallFlags_Value|CallFlags_New),CallFlags_New);
    if (CVar3 != CallFlags_None) {
      bVar2 = Arguments::HasNewTarget((Arguments *)local_40);
      if (bVar2) {
        pvVar12 = Arguments::GetNewTarget((Arguments *)local_40);
        bVar2 = Js::JavascriptOperators::IsConstructor(pvVar12);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                      ,0x7d,"(JavascriptOperators::IsConstructor(newTargetVar))",
                                      "newTarget must be a constructor");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        newTargetVar = UnsafeVarTo<Js::RecyclableObject>(pvVar12);
        autoReentrancyHandler._8_8_ =
             Js::JavascriptOperators::GetConstructorFunctionInfo(obj,scriptContext_00);
        if (((FunctionInfo *)autoReentrancyHandler._8_8_ == (FunctionInfo *)0x0) ||
           (bVar2 = FunctionInfo::IsClassConstructor((FunctionInfo *)autoReentrancyHandler._8_8_),
           !bVar2)) {
          pTVar10 = ScriptContext::GetThreadContext(scriptContext_00);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_90,pTVar10);
          newTargetVar = Js::JavascriptOperators::CreateFromConstructor
                                   ((RecyclableObject *)newTargetVar,scriptContext_00);
          *(Var *)args.Info = newTargetVar;
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_90);
        }
        else {
          *(Var *)args.Info = newTargetVar;
        }
      }
      else {
        bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
        if (bVar2) {
          *(undefined8 *)args.Info = 0;
        }
        else {
          pTVar10 = ScriptContext::GetThreadContext(scriptContext_00);
          AutoReentrancyHandler::AutoReentrancyHandler
                    ((AutoReentrancyHandler *)&actualArgs.Values,pTVar10);
          newTargetVar = Js::JavascriptOperators::NewScObjectNoCtor(obj,scriptContext_00);
          *(Var *)args.Info = newTargetVar;
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)&actualArgs.Values)
          ;
        }
      }
    }
    Arguments::Arguments((Arguments *)&newArgCount,(Arguments *)local_40);
    if (*(int *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject == 0) {
      CVar3 = Js::operator&(CVar6 & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                     CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|
                                     CallFlags_Value|CallFlags_New),CallFlags_New);
      bVar2 = operator!(CVar3);
      if (bVar2) {
        ppvVar15 = Memory::WriteBarrierPtr::operator_cast_to_void__
                             ((WriteBarrierPtr *)&function[3].type);
        *(void **)actualArgs.Info = *ppvVar15;
      }
    }
    else {
      newValues._4_4_ = local_40._0_4_ & 0xffffff;
      lhs = *(uint32 *)
             &function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject;
      uVar4 = Arguments::GetLargeArgCountWithExtraArgs((Arguments *)local_40);
      newValues._0_4_ = UInt32Math::Add(lhs,uVar4);
      if (0xffffff < (uint32)newValues) {
        JavascriptError::ThrowRangeError(scriptContext_00,-0x7ff5ec52,(PCWSTR)0x0);
      }
      pRVar11 = ScriptContext::GetRecycler(scriptContext_00);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_f8,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                 (ulong)(uint32)newValues,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                 ,0xb0);
      pRVar11 = Memory::Recycler::TrackAllocInfo(pRVar11,&local_f8);
      _i = Memory::Recycler::Alloc;
      local_100 = 0;
      local_d0 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                           ((Memory *)pRVar11,(Recycler *)Memory::Recycler::Alloc,0,
                            (ulong)(uint32)newValues);
      i_1 = 0;
      CVar3 = Js::operator&(CVar6 & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                     CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|
                                     CallFlags_Value|CallFlags_New),CallFlags_New);
      if (CVar3 == CallFlags_None) {
        uVar13 = (ulong)i_1;
        i_1 = i_1 + 1;
        Memory::WriteBarrierPtr<void>::operator=
                  (local_d0 + uVar13,(WriteBarrierPtr<void> *)&function[3].type);
      }
      else {
        pvVar12 = Arguments::operator[]((Arguments *)local_40,0);
        uVar13 = (ulong)i_1;
        i_1 = i_1 + 1;
        Memory::WriteBarrierPtr<void>::operator=(local_d0 + uVar13,pvVar12);
      }
      for (local_110 = 0;
          local_110 <
          *(uint *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject; local_110 = local_110 + 1) {
        ppWVar14 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                             ((WriteBarrierPtr *)&function[4].type);
        uVar13 = (ulong)i_1;
        i_1 = i_1 + 1;
        Memory::WriteBarrierPtr<void>::operator=(local_d0 + uVar13,*ppWVar14 + local_110);
      }
      for (local_114 = 1; local_114 < newValues._4_4_; local_114 = local_114 + 1) {
        pvVar12 = Arguments::operator[]((Arguments *)local_40,local_114);
        uVar13 = (ulong)i_1;
        i_1 = i_1 + 1;
        Memory::WriteBarrierPtr<void>::operator=(local_d0 + uVar13,pvVar12);
      }
      bVar2 = Arguments::HasExtraArg((Arguments *)local_40);
      if (bVar2) {
        uVar13 = (ulong)i_1;
        i_1 = i_1 + 1;
        Memory::WriteBarrierPtr<void>::operator=
                  (local_d0 + uVar13,*(void **)((long)args.Info + (ulong)newValues._4_4_ * 8));
      }
      ppvVar15 = unsafe_write_barrier_cast<void**,Memory::WriteBarrierPtr<void>*>(local_d0);
      Arguments::Arguments(&local_128,(CallInfo)local_40,ppvVar15);
      uVar4 = i_1;
      actualArgs.Info = (Type)local_128.Values;
      _newArgCount = (Type)((ulong)local_128.Info & 0xffffffffff000000 |
                           (ulong)(*(int *)&function[4].super_FinalizableObject.
                                            super_IRecyclerVisitedObject.
                                            _vptr_IRecyclerVisitedObject + newValues._4_4_) &
                           0xffffff);
      uVar5 = Arguments::GetLargeArgCountWithExtraArgs((Arguments *)&newArgCount);
      if (uVar4 != uVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                    ,0xd3,"(index == actualArgs.GetLargeArgCountWithExtraArgs())",
                                    "index == actualArgs.GetLargeArgCountWithExtraArgs()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    autoReentrancyHandler_2.m_savedReentrancySafeOrHandled = false;
    autoReentrancyHandler_2._9_7_ = 0;
    pTVar10 = ScriptContext::GetThreadContext(scriptContext_00);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_148,pTVar10);
    entryPoint = RecyclableObject::GetEntryPoint(obj);
    Arguments::Arguments(&local_158,(Arguments *)&newArgCount);
    autoReentrancyHandler_2._8_8_ =
         JavascriptFunction::CallFunction<true>(obj,entryPoint,&local_158,true);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_148);
    CVar6 = Js::operator&(CVar6 & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                   CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|
                                   CallFlags_Value|CallFlags_New),CallFlags_New);
    if ((CVar6 != CallFlags_None) &&
       (BVar7 = Js::JavascriptOperators::IsObject((Var)autoReentrancyHandler_2._8_8_), BVar7 == 0))
    {
      autoReentrancyHandler_2._8_8_ = newTargetVar;
    }
    return (Var)autoReentrancyHandler_2._8_8_;
  }
  JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec76,(PCWSTR)0x0);
}

Assistant:

Var BoundFunction::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction /* TODO-ERROR: get arg name - args[0] */);
        }

        BoundFunction *boundFunction = (BoundFunction *) function;
        RecyclableObject *targetFunction = boundFunction->targetFunction;

        //
        // var o = new boundFunction()
        // a new object should be created using the actual function object
        //
        Var newVarInstance = nullptr;
        if (callInfo.Flags & CallFlags_New)
        {
            if (args.HasNewTarget())
            {
                // target has an overridden new target make a new object from the newTarget
                Var newTargetVar = args.GetNewTarget();
                AssertOrFailFastMsg(JavascriptOperators::IsConstructor(newTargetVar), "newTarget must be a constructor");
                RecyclableObject* newTarget = UnsafeVarTo<RecyclableObject>(newTargetVar);

                // Class constructors expect newTarget to be in args slot 0 (usually "this"),
                // because "this" is not constructed until we reach the most-super superclass.
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetFunction, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    args.Values[0] = newVarInstance = newTarget;
                }
                else
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        args.Values[0] = newVarInstance = JavascriptOperators::CreateFromConstructor(newTarget, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
            else if (!VarIs<JavascriptProxy>(targetFunction))
            {
                // No new target and target is not a proxy can make a new object in a "normal" way.
                // NewScObjectNoCtor will either construct an object or return targetFunction depending
                // on whether targetFunction is a class constructor.
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    args.Values[0] = newVarInstance = JavascriptOperators::NewScObjectNoCtor(targetFunction, scriptContext);
                }
                END_SAFE_REENTRANT_CALL
            }
            else
            {
                // target is a proxy without an overridden new target
                // give nullptr - FunctionCallTrap will make a new object
                args.Values[0] = newVarInstance;
            }
        }

        Js::Arguments actualArgs = args;

        if (boundFunction->count > 0)
        {
            // OACR thinks that this can change between here and the check in the for loop below
            const unsigned int argCount = args.Info.Count;

            uint32 newArgCount = UInt32Math::Add(boundFunction->count, args.GetLargeArgCountWithExtraArgs());
            if (newArgCount > CallInfo::kMaxCountArgs)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            Field(Var) *newValues = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), newArgCount);
            uint index = 0;

            //
            // For [[Construct]] use the newly created var instance
            // For [[Call]] use the "this" to which bind bound it.
            //
            if (callInfo.Flags & CallFlags_New)
            {
                newValues[index++] = args[0];
            }
            else
            {
                newValues[index++] = boundFunction->boundThis;
            }

            for (uint i = 0; i < boundFunction->count; i++)
            {
                newValues[index++] = boundFunction->boundArgs[i];
            }

            // Copy the extra args
            for (uint i=1; i<argCount; i++)
            {
                newValues[index++] = args[i];
            }

            if (args.HasExtraArg())
            {
                newValues[index++] = args.Values[argCount];
            }

            actualArgs = Arguments(args.Info, unsafe_write_barrier_cast<Var*>(newValues));
            actualArgs.Info.Count = boundFunction->count + argCount;

            Assert(index == actualArgs.GetLargeArgCountWithExtraArgs());
        }
        else
        {
            if (!(callInfo.Flags & CallFlags_New))
            {
                actualArgs.Values[0] = boundFunction->boundThis;
            }
        }

        Var aReturnValue = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the larger argcount logic for this call.
            aReturnValue = JavascriptFunction::CallFunction<true>(targetFunction, targetFunction->GetEntryPoint(), actualArgs, /* useLargeArgCount */ true);
        }
        END_SAFE_REENTRANT_CALL

        //
        // [[Construct]] and call returned a non-object
        // return the newly created var instance
        //
        if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
        {
            aReturnValue = newVarInstance;
        }

        return aReturnValue;
    }